

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
::DeallocateIfAllocated
          (Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
           *this)

{
  if (((this->metadata_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<unsigned_long,_1UL,_false>.value & 1) == 0) {
    return;
  }
  operator_delete((this->data_).allocated.allocated_data,
                  (this->data_).allocated.allocated_capacity << 4);
  return;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }